

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O3

int __thiscall
chrono::collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition
          (ChConvexDecompositionHACDv2 *this)

{
  pointer pCVar1;
  pointer pCVar2;
  uint uVar3;
  int iVar4;
  HaU32 *pHVar5;
  HaF32 *pHVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> triangles_FUSED;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> points_FUSED;
  MyCallback callback;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> local_88;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_68;
  pointer local_48;
  pointer local_40;
  ICallback local_38;
  
  if (this->gHACD == (HACD_API *)0x0) {
    iVar4 = 0;
  }
  else {
    local_88.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    FuseMesh(&this->points,&this->triangles,&local_68,&local_88,this->fuse_tol);
    pCVar2 = local_68.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = local_88.
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_40 = local_88.
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = ((long)local_88.
                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.
                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    (this->descriptor).mTriangleCount = (HaU32)uVar9;
    local_48 = local_68.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    lVar10 = (long)local_68.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    uVar11 = lVar10 * -0x5555555555555555;
    (this->descriptor).mVertexCount = (HaU32)uVar11;
    pHVar5 = (HaU32 *)operator_new__((long)local_88.
                                           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_88.
                                           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start & 0x3fffffffc);
    (this->descriptor).mIndices = pHVar5;
    pHVar6 = (HaF32 *)operator_new__(lVar10 * 4 & 0x3fffffffc);
    (this->descriptor).mVertices = pHVar6;
    if (local_48 != pCVar2) {
      uVar8 = 0;
      uVar7 = 1;
      do {
        pHVar6[uVar8 & 0xffffffff] = (HaF32)(float)pCVar2->m_data[uVar8];
        iVar4 = (int)uVar8;
        pHVar6[iVar4 + 1] = (HaF32)(float)pCVar2->m_data[uVar8 + 1];
        lVar10 = uVar8 + 2;
        uVar8 = uVar8 + 3;
        pHVar6[iVar4 + 2] = (HaF32)(float)pCVar2->m_data[lVar10];
        bVar12 = uVar7 <= uVar11;
        lVar10 = uVar11 - uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar12 && lVar10 != 0);
    }
    if (local_40 != pCVar1) {
      uVar3 = 1;
      uVar11 = 0;
      do {
        pHVar5[uVar11 & 0xffffffff] = pCVar1->m_data[uVar11];
        iVar4 = (int)uVar11;
        pHVar5[iVar4 + 1] = pCVar1->m_data[uVar11 + 1];
        lVar10 = uVar11 + 2;
        uVar11 = uVar11 + 3;
        pHVar5[iVar4 + 2] = pCVar1->m_data[lVar10];
        uVar7 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar7 <= uVar9 && uVar9 - uVar7 != 0);
    }
    local_38._vptr_ICallback = (_func_int **)&PTR_ReportProgress_00b3d0d0;
    (this->descriptor).mCallback = &local_38;
    iVar4 = (**this->gHACD->_vptr_HACD_API)(this->gHACD,&this->descriptor);
    pHVar5 = (this->descriptor).mIndices;
    if (pHVar5 != (HaU32 *)0x0) {
      operator_delete__(pHVar5);
    }
    pHVar6 = (this->descriptor).mVertices;
    if (pHVar6 != (HaF32 *)0x0) {
      operator_delete__(pHVar6);
    }
    (this->descriptor).mTriangleCount = 0;
    (this->descriptor).mVertexCount = 0;
    if (local_88.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return iVar4;
}

Assistant:

int ChConvexDecompositionHACDv2::ComputeConvexDecomposition() {
    if (!gHACD)
        return 0;

    // Preprocess: fuse repeated vertices...

    std::vector<ChVector<double> > points_FUSED;
    std::vector<ChVector<int> > triangles_FUSED;
    FuseMesh(this->points, this->triangles, points_FUSED, triangles_FUSED, this->fuse_tol);

    // Convert to HACD format

    this->descriptor.mTriangleCount = (hacd::HaU32)triangles_FUSED.size();
    this->descriptor.mVertexCount = (hacd::HaU32)points_FUSED.size();
    this->descriptor.mIndices = new hacd::HaU32[3 * this->descriptor.mTriangleCount];
    this->descriptor.mVertices = new hacd::HaF32[3 * this->descriptor.mVertexCount];
    for (unsigned int mv = 0; mv < points_FUSED.size(); mv++) {
        ((hacd::HaF32*)descriptor.mVertices)[mv * 3 + 0] = (float)points_FUSED[mv].x();
        ((hacd::HaF32*)descriptor.mVertices)[mv * 3 + 1] = (float)points_FUSED[mv].y();
        ((hacd::HaF32*)descriptor.mVertices)[mv * 3 + 2] = (float)points_FUSED[mv].z();
    }
    for (unsigned int mt = 0; mt < triangles_FUSED.size(); mt++) {
        ((hacd::HaU32*)descriptor.mIndices)[mt * 3 + 0] = triangles_FUSED[mt].x();
        ((hacd::HaU32*)descriptor.mIndices)[mt * 3 + 1] = triangles_FUSED[mt].y();
        ((hacd::HaU32*)descriptor.mIndices)[mt * 3 + 2] = triangles_FUSED[mt].z();
    }

    MyCallback callback;
    descriptor.mCallback = static_cast<hacd::ICallback*>(&callback);

    // Perform the decomposition!

    hacd::HaU32 hullCount = gHACD->performHACD(this->descriptor);

    delete[] this->descriptor.mIndices;
    delete[] this->descriptor.mVertices;
    this->descriptor.mTriangleCount = 0;
    this->descriptor.mVertexCount = 0;

    return hullCount;
}